

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ntru.c
# Opt level: O0

void ntru_bias(uint16_t *out,uint16_t *in,uint bias,uint p,uint q)

{
  uint16_t uVar1;
  uint64_t qrecip_00;
  uint local_34;
  uint i;
  uint64_t qrecip;
  uint q_local;
  uint p_local;
  uint bias_local;
  uint16_t *in_local;
  uint16_t *out_local;
  
  qrecip_00 = reciprocal_for_reduction((uint16_t)q);
  for (local_34 = 0; local_34 < p; local_34 = local_34 + 1) {
    uVar1 = reduce(in[local_34] + bias,(uint16_t)q,qrecip_00);
    out[local_34] = uVar1;
  }
  return;
}

Assistant:

void ntru_bias(uint16_t *out, const uint16_t *in, unsigned bias,
               unsigned p, unsigned q)
{
    SETUP;
    for (unsigned i = 0; i < p; i++)
        out[i] = REDUCE(in[i] + bias);
}